

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raytraced_renderer.cpp
# Opt level: O2

void __thiscall
CGL::RaytracedRenderer::save_image(RaytracedRenderer *this,string *filename,ImageBuffer *buffer)

{
  size_t sVar1;
  size_t sVar2;
  bool bVar3;
  size_t i;
  tm *ptVar4;
  ostream *poVar5;
  uchar *in;
  long lVar6;
  pointer __src;
  size_t sVar7;
  ImageBuffer *pIVar8;
  uchar *__dest;
  ulong uVar9;
  time_t t;
  time_t rawtime;
  string local_1f8 [32];
  string local_1d8 [32];
  stringstream ss;
  ostream local_1a8 [376];
  
  if (this->state == DONE) {
    pIVar8 = &this->frameBuffer;
    if (buffer != (ImageBuffer *)0x0) {
      pIVar8 = buffer;
    }
    bVar3 = std::operator==(filename,"");
    if (bVar3) {
      time(&rawtime);
      t = time((time_t *)0x0);
      ptVar4 = localtime(&t);
      std::__cxx11::stringstream::stringstream((stringstream *)&ss);
      poVar5 = std::operator<<(local_1a8,(string *)&this->filename);
      poVar5 = std::operator<<(poVar5,"_screenshot_");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,ptVar4->tm_mon + 1);
      poVar5 = std::operator<<(poVar5,"-");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,ptVar4->tm_mday);
      poVar5 = std::operator<<(poVar5,"_");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,ptVar4->tm_hour);
      poVar5 = std::operator<<(poVar5,"-");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,ptVar4->tm_min);
      poVar5 = std::operator<<(poVar5,"-");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,ptVar4->tm_sec);
      std::operator<<(poVar5,".png");
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::operator=((string *)filename,local_1d8);
      std::__cxx11::string::~string(local_1d8);
      std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
    }
    sVar1 = pIVar8->w;
    sVar2 = pIVar8->h;
    uVar9 = sVar2 * sVar1;
    __src = (pIVar8->data).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start + (sVar2 - 1) * sVar1;
    in = (uchar *)operator_new__(-(ulong)(uVar9 >> 0x3e != 0) | uVar9 * 4);
    sVar7 = sVar2;
    __dest = in;
    while (bVar3 = sVar7 != 0, sVar7 = sVar7 - 1, bVar3) {
      memcpy(__dest,__src,sVar1 * 4);
      __src = __src + -sVar1;
      __dest = __dest + sVar1 * 4;
    }
    for (lVar6 = 0; uVar9 - lVar6 != 0; lVar6 = lVar6 + 1) {
      in[lVar6 * 4 + 3] = 0xff;
    }
    fprintf(_stderr,"[PathTracer] Saving to file: %s... ",(filename->_M_dataplus)._M_p);
    lodepng::encode(filename,in,(uint)sVar1,(uint)sVar2,LCT_RGBA,8);
    fwrite("Done!\n",6,1,_stderr);
    operator_delete__(in);
    std::__cxx11::string::string(local_1f8,(string *)filename);
    (*(this->super_OfflineRenderer)._vptr_OfflineRenderer[0xf])(this,local_1f8);
    std::__cxx11::string::~string(local_1f8);
  }
  return;
}

Assistant:

void RaytracedRenderer::save_image(string filename, ImageBuffer* buffer) {

  if (state != DONE) return;

  if (!buffer)
    buffer = &frameBuffer;

  if (filename == "") {
    time_t rawtime;
    time (&rawtime);

    time_t t = time(nullptr);
    tm *lt = localtime(&t);
    stringstream ss;
    ss << this->filename << "_screenshot_" << lt->tm_mon+1 << "-" << lt->tm_mday << "_" 
      << lt->tm_hour << "-" << lt->tm_min << "-" << lt->tm_sec << ".png";
    filename = ss.str();  
  }

  uint32_t* frame = &buffer->data[0];
  size_t w = buffer->w;
  size_t h = buffer->h;
  uint32_t* frame_out = new uint32_t[w * h];
  for(size_t i = 0; i < h; ++i) {
    memcpy(frame_out + i * w, frame + (h - i - 1) * w, 4 * w);
  }
  
  for (size_t i = 0; i < w * h; ++i) {
    frame_out[i] |= 0xFF000000;
  }

  fprintf(stderr, "[PathTracer] Saving to file: %s... ", filename.c_str());
  lodepng::encode(filename, (unsigned char*) frame_out, w, h);
  fprintf(stderr, "Done!\n");
  
  delete[] frame_out;

  save_sampling_rate_image(filename);
}